

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Menu_.cxx
# Opt level: O3

Fl_Menu_Item * first_submenu_item(Fl_Menu_Item *item,Fl_Menu_Item *start)

{
  Fl_Menu_Item *pFVar1;
  int iVar2;
  Fl_Menu_Item *pFVar3;
  
  iVar2 = 0;
  pFVar3 = start;
  do {
    if (pFVar3->text == (char *)0x0) {
      if (iVar2 == 0) {
        return (Fl_Menu_Item *)0x0;
      }
      iVar2 = iVar2 + -1;
    }
    else {
      if (pFVar3 == item) {
        return start;
      }
      if ((pFVar3->flags & 0x20U) == 0) {
        iVar2 = iVar2 + (uint)(((uint)pFVar3->flags >> 6 & 1) != 0);
      }
      else {
        pFVar1 = first_submenu_item(item,(Fl_Menu_Item *)pFVar3->user_data_);
        if (pFVar1 != (Fl_Menu_Item *)0x0) {
          return pFVar1;
        }
      }
    }
    pFVar3 = pFVar3 + 1;
  } while( true );
}

Assistant:

static Fl_Menu_Item *first_submenu_item(Fl_Menu_Item *item, Fl_Menu_Item *start)
{
  Fl_Menu_Item* m = start;
  int nest = 0; // will indicate submenu nesting depth
  while (1) { // loop over all menu items
    if (!m->text) { // m is a null item
      if (!nest) return NULL; // item was not found
      nest--; // m marks the end of a submenu -> decrement submenu nesting depth
    } else { // a true item
      if (m == item) return start; // item is found, return menu start item
      if (m->flags & FL_SUBMENU_POINTER) {
        // scan the detached submenu which begins at m->user_data()
        Fl_Menu_Item *first = first_submenu_item(item, (Fl_Menu_Item*)m->user_data());
        if (first) return first; // if item was found in the submenu, return
      }
      else if (m->flags & FL_SUBMENU) { // a direct submenu
        nest++; // increment submenu nesting depth
      }
    }
    m++; // step to next menu item
  }
}